

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeNewRowid(Rtree *pRtree,i64 *piRowid)

{
  int iVar1;
  sqlite3_int64 sVar2;
  int rc;
  i64 *piRowid_local;
  Rtree *pRtree_local;
  
  sqlite3_bind_null(pRtree->pWriteRowid,1);
  sqlite3_bind_null(pRtree->pWriteRowid,2);
  sqlite3_step(pRtree->pWriteRowid);
  iVar1 = sqlite3_reset(pRtree->pWriteRowid);
  sVar2 = sqlite3_last_insert_rowid(pRtree->db);
  *piRowid = sVar2;
  return iVar1;
}

Assistant:

static int rtreeNewRowid(Rtree *pRtree, i64 *piRowid){
  int rc;
  sqlite3_bind_null(pRtree->pWriteRowid, 1);
  sqlite3_bind_null(pRtree->pWriteRowid, 2);
  sqlite3_step(pRtree->pWriteRowid);
  rc = sqlite3_reset(pRtree->pWriteRowid);
  *piRowid = sqlite3_last_insert_rowid(pRtree->db);
  return rc;
}